

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

void square_free_trap(chunk *c,loc grid)

{
  trap *ptVar1;
  trap *p;
  
  p = square_trap((chunk_conflict *)c,grid);
  while (p != (trap *)0x0) {
    ptVar1 = p->next;
    mem_free(p);
    p = ptVar1;
  }
  return;
}

Assistant:

void square_free_trap(struct chunk *c, struct loc grid)
{
	struct trap *next, *trap = square_trap(c, grid);

	while (trap) {
		next = trap->next;
		mem_free(trap);
		trap = next;
	}
}